

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-mon.c
# Opt level: O1

void project_monster_handler_MON_HEAL(project_monster_handler_context_t *context)

{
  byte *pbVar1;
  monster *pmVar2;
  short sVar3;
  
  pmVar2 = context->mon;
  sVar3 = pmVar2->hp + (short)context->dam;
  if (pmVar2->maxhp <= sVar3) {
    sVar3 = pmVar2->maxhp;
  }
  pmVar2->hp = sVar3;
  if (player->upkeep->health_who == pmVar2) {
    pbVar1 = (byte *)((long)&player->upkeep->redraw + 1);
    *pbVar1 = *pbVar1 | 2;
  }
  else {
    context->hurt_msg = MON_MSG_HEALTHIER;
  }
  context->dam = L'\0';
  return;
}

Assistant:

static void project_monster_handler_MON_HEAL(project_monster_handler_context_t *context)
{
	/* Heal */
	context->mon->hp += context->dam;

	/* No overflow */
	if (context->mon->hp > context->mon->maxhp)
		context->mon->hp = context->mon->maxhp;

	/* Redraw (later) if needed */
	if (player->upkeep->health_who == context->mon)
		player->upkeep->redraw |= (PR_HEALTH);

	/* Message */
	else context->hurt_msg = MON_MSG_HEALTHIER;

	/* No "real" damage */
	context->dam = 0;
}